

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmissionSystem.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::DATA_TYPE::EmissionSystem::operator==(EmissionSystem *this,EmissionSystem *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  if (this->m_ui8SystemDataLength != Value->m_ui8SystemDataLength) {
    return false;
  }
  if (((this->m_ui8NumberOfBeams == Value->m_ui8NumberOfBeams) &&
      (KVar1 = EmitterSystem::operator!=(&this->m_EmitterSystemRecord,&Value->m_EmitterSystemRecord)
      , !KVar1)) && (KVar1 = Vector::operator!=(&this->m_Location,&Value->m_Location), !KVar1)) {
    bVar2 = std::operator!=(&this->m_vEmitterBeams,&Value->m_vEmitterBeams);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL EmissionSystem::operator == ( const EmissionSystem & Value ) const
{
    if( m_ui8SystemDataLength   != Value.m_ui8SystemDataLength )    return false;
    if( m_ui8NumberOfBeams      != Value.m_ui8NumberOfBeams )       return false;
    if( m_EmitterSystemRecord   != Value.m_EmitterSystemRecord )    return false;
    if( m_Location              != Value.m_Location )               return false;
    if( m_vEmitterBeams         != Value.m_vEmitterBeams )          return false;
    return true;
}